

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midimixup.cpp
# Opt level: O0

void checkOptions(Options *opts)

{
  Options *pOVar1;
  bool bVar2;
  ostream *poVar3;
  char *command;
  allocator local_291;
  string local_290;
  allocator local_269;
  string local_268;
  string local_248;
  allocator local_221;
  string local_220;
  allocator local_1f9;
  string local_1f8;
  allocator local_1d1;
  string local_1d0;
  allocator local_1a9;
  string local_1a8;
  allocator local_181;
  string local_180;
  allocator local_159;
  string local_158;
  allocator local_131;
  string local_130;
  allocator local_109;
  string local_108;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  Options *local_10;
  Options *opts_local;
  
  local_10 = opts;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"r|reverse=b",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"Reverse the order of notes",&local_69);
  smf::Options::define(opts,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pOVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"author=b",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"Author of the program",&local_b9);
  smf::Options::define(pOVar1,&local_90,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  pOVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"version=b",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"Print version of the program",&local_109);
  smf::Options::define(pOVar1,&local_e0,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  pOVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"example=b",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"Display example use of the program",&local_159)
  ;
  smf::Options::define(pOVar1,&local_130,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  pOVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"help=b",&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a8,"Dispay help for the program",&local_1a9);
  smf::Options::define(pOVar1,&local_180,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  smf::Options::process(local_10,1,0);
  pOVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,"author",&local_1d1);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  pOVar1 = local_10;
  if (bVar2) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Written by Craig Stuart Sapp, ");
    poVar3 = std::operator<<(poVar3,"craig@ccrma.stanford.edu, 2 December 1999");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f8,"version",&local_1f9);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  if (bVar2) {
    poVar3 = std::operator<<((ostream *)&std::cout,"midimixup version 2.0");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"compiled: ");
    poVar3 = std::operator<<(poVar3,"Apr 26 2025");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  pOVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_220,"help",&local_221);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  pOVar1 = local_10;
  if (bVar2) {
    smf::Options::getCommand_abi_cxx11_(&local_248,local_10);
    command = (char *)std::__cxx11::string::c_str();
    usage(command);
    std::__cxx11::string::~string((string *)&local_248);
    exit(0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_268,"example",&local_269);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  pOVar1 = local_10;
  if (bVar2) {
    example();
    exit(0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_290,"reverse",&local_291);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_290);
  reverseQ = (int)bVar2;
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  return;
}

Assistant:

void checkOptions(Options& opts) {
	opts.define("r|reverse=b", "Reverse the order of notes");

	opts.define("author=b",    "Author of the program");
	opts.define("version=b",   "Print version of the program");
	opts.define("example=b",   "Display example use of the program");
	opts.define("help=b",      "Dispay help for the program");
	opts.process();

	if (opts.getBoolean("author")) {
		cout << "Written by Craig Stuart Sapp, "
			  << "craig@ccrma.stanford.edu, 2 December 1999" << endl;
		exit(0);
	}
	if (opts.getBoolean("version")) {
		cout << "midimixup version 2.0" << endl;
		cout << "compiled: " << __DATE__ << endl;
	}
	if (opts.getBoolean("help")) {
		usage(opts.getCommand().c_str());
		exit(0);
	}
	if (opts.getBoolean("example")) {
		example();
		exit(0);
	}

	reverseQ = opts.getBoolean("reverse");
}